

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O3

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  Curl_llist *list;
  char cVar1;
  uchar uVar2;
  char *pcVar3;
  size_t sVar4;
  Curl_header_store *ne;
  Curl_header_store *pCVar5;
  char *pcVar6;
  size_t __n;
  long lVar7;
  char *pcVar8;
  uchar *puVar9;
  char cVar10;
  
  cVar10 = *header;
  if (cVar10 == '\n') {
    return CURLE_OK;
  }
  if (cVar10 == '\r') {
    return CURLE_OK;
  }
  pcVar3 = strchr(header,0xd);
  if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(header,10), pcVar3 == (char *)0x0)) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  lVar7 = (long)pcVar3 - (long)header;
  if ((cVar10 == ' ') || (cVar10 == '\t')) {
    pCVar5 = (data->state).prevhead;
    if (pCVar5 == (Curl_header_store *)0x0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    pcVar6 = pCVar5->value;
    sVar4 = strlen(pcVar6);
    if (lVar7 + 1U != 0) {
      pcVar3 = header + ~(ulong)pcVar3;
      pcVar8 = header + lVar7;
      do {
        cVar1 = *pcVar8;
        if (((cVar1 != '\t') && (cVar1 != ' ')) && (3 < (byte)(cVar1 - 10U))) {
          __n = -(long)pcVar3;
          if (1 < __n) goto LAB_00134b4f;
          __n = 1;
          goto LAB_001349ab;
        }
        pcVar8 = pcVar8 + -1;
        pcVar3 = pcVar3 + 1;
      } while (pcVar3 != (char *)0x0);
    }
    __n = 0;
    goto LAB_001349ab;
  }
  pCVar5 = (Curl_header_store *)(*Curl_ccalloc)(1,lVar7 + 0x31);
  if (pCVar5 == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar3 = pCVar5->buffer;
  memcpy(pcVar3,header,lVar7 + 1U);
  *(undefined1 *)((long)pCVar5 + lVar7 + 0x2e) = 0;
  pcVar6 = pcVar3;
  if (type == '\x10') {
    if (*pcVar3 != ':') goto LAB_00134abf;
    pcVar6 = &pCVar5->field_0x2e;
  }
  while( true ) {
    pcVar8 = pcVar6;
    pcVar6 = pcVar8 + 1;
    if (*pcVar8 == '\0') break;
    if (*pcVar8 == ':') {
      *pcVar8 = '\0';
      for (; (*pcVar6 == ' ' || (*pcVar6 == '\t')); pcVar6 = pcVar6 + 1) {
      }
      for (puVar9 = (uchar *)(pcVar3 + lVar7);
          (pcVar6 < puVar9 &&
          (((uVar2 = *puVar9, uVar2 == '\t' || (uVar2 == ' ')) || ((byte)(uVar2 - 10) < 4))));
          puVar9 = puVar9 + -1) {
        *puVar9 = '\0';
      }
      pCVar5->name = pcVar3;
      pCVar5->value = pcVar6;
      pCVar5->type = type;
      pCVar5->request = (data->state).requests;
      Curl_llist_insert_next
                (&(data->state).httphdrs,(data->state).httphdrs.tail,pCVar5,
                 (Curl_llist_element *)pCVar5);
      (data->state).prevhead = pCVar5;
      return CURLE_OK;
    }
  }
LAB_00134abf:
  (*Curl_cfree)(pCVar5);
  return CURLE_BAD_FUNCTION_ARGUMENT;
  while( true ) {
    header = header + 1;
    __n = __n - 1;
    if (__n < 2) break;
LAB_00134b4f:
    if (((cVar10 != ' ') && (cVar10 != '\t')) ||
       ((cVar10 = header[1], cVar10 != ' ' && (cVar10 != '\t')))) goto LAB_001349ab;
  }
  __n = 1;
  header = pcVar8;
LAB_001349ab:
  list = &(data->state).httphdrs;
  Curl_llist_remove(list,&pCVar5->node,(void *)0x0);
  ne = (Curl_header_store *)
       Curl_saferealloc(pCVar5,(size_t)(pcVar6 + __n + sVar4 + -(long)pCVar5 + 5));
  if (ne == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  ne->name = ne->buffer;
  ne->value = pcVar6 + -(long)pCVar5 + (long)(ne->buffer + -0x2d);
  memcpy(pcVar6 + -(long)pCVar5 + (long)(ne->buffer + -0x2d) + sVar4,header,__n);
  ne->value[__n + sVar4] = '\0';
  Curl_llist_insert_next(list,(data->state).httphdrs.tail,ne,(Curl_llist_element *)ne);
  (data->state).prevhead = ne;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  hlen = end - header + 1;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else
      /* can't unfold without a previous header */
      return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(result)
    goto fail;

  hs->name = name;
  hs->value = value;
  hs->type = type;
  hs->request = data->state.requests;

  /* insert this node into the list of headers */
  Curl_llist_insert_next(&data->state.httphdrs, data->state.httphdrs.tail,
                         hs, &hs->node);
  data->state.prevhead = hs;
  return CURLE_OK;
  fail:
  free(hs);
  return result;
}